

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Swapchain.cpp
# Opt level: O3

Ptr<Swapchain> __thiscall
myvk::Swapchain::Create
          (Swapchain *this,Ptr<Queue> *graphics_queue,Ptr<PresentQueue> *present_queue,
          bool use_vsync,VkImageUsageFlags image_usage)

{
  VkPhysicalDevice pVVar1;
  VkSurfaceKHR pVVar2;
  PFN_vkCreateSwapchainKHR p_Var3;
  PFN_vkGetSwapchainImagesKHR p_Var4;
  element_type *peVar5;
  int iVar6;
  VkResult VVar7;
  VkPresentModeKHR *i_1;
  undefined4 extraout_var;
  pointer pVVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar9;
  uint uVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  VkPresentModeKHR VVar13;
  VkSwapchainCreateInfoKHR *pVVar14;
  _func_int **pp_Var15;
  VkFormat VVar16;
  VkColorSpaceKHR VVar17;
  byte bVar18;
  Ptr<Swapchain> PVar19;
  uint32_t present_mode_count;
  uint32_t format_count;
  shared_ptr<myvk::Swapchain> ret;
  int height;
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> present_modes;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> surface_formats;
  VkSurfaceCapabilitiesKHR capabilities;
  int width;
  uint local_140;
  uint local_13c;
  _func_int **local_138;
  element_type *peStack_130;
  VkImageUsageFlags local_120;
  uint local_11c;
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> local_118;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> local_f8;
  VkSurfaceCapabilitiesKHR local_d4;
  uint32_t local_a0 [2];
  VkSwapchainCreateInfoKHR local_98;
  
  bVar18 = 0;
  local_120 = image_usage;
  std::__shared_ptr<myvk::Swapchain,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<myvk::Swapchain>>
            ((__shared_ptr<myvk::Swapchain,(__gnu_cxx::_Lock_policy)2> *)&local_138,
             (allocator<myvk::Swapchain> *)&local_98);
  local_138[3] = (_func_int *)
                 (graphics_queue->super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 4),
             &(graphics_queue->super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  local_138[5] = (_func_int *)
                 (present_queue->super___shared_ptr<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2>)
                 ._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 6),
             &(present_queue->super___shared_ptr<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  iVar6 = (*(((graphics_queue->super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
            ->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  pVVar1 = *(VkPhysicalDevice *)(*(long *)(*(long *)CONCAT44(extraout_var,iVar6) + 0x18) + 0x28);
  pVVar2 = ((((present_queue->super___shared_ptr<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->m_surface_ptr).super___shared_ptr<myvk::Surface,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->m_surface;
  local_f8.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
  super__Vector_impl_data._M_start = (VkPresentModeKHR *)0x0;
  local_118.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
  super__Vector_impl_data._M_finish = (VkPresentModeKHR *)0x0;
  (*vkGetPhysicalDeviceSurfaceCapabilitiesKHR)(pVVar1,pVVar2,&local_d4);
  (*vkGetPhysicalDeviceSurfaceFormatsKHR)(pVVar1,pVVar2,&local_13c,(VkSurfaceFormatKHR *)0x0);
  if ((ulong)local_13c != 0) {
    std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::resize
              (&local_f8,(ulong)local_13c);
    (*vkGetPhysicalDeviceSurfaceFormatsKHR)
              (pVVar1,pVVar2,&local_13c,
               local_f8.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
               _M_impl.super__Vector_impl_data._M_start);
  }
  (*vkGetPhysicalDeviceSurfacePresentModesKHR)(pVVar1,pVVar2,&local_140,(VkPresentModeKHR *)0x0);
  if ((ulong)local_140 != 0) {
    std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::resize
              (&local_118,(ulong)local_140);
    (*vkGetPhysicalDeviceSurfacePresentModesKHR)
              (pVVar1,pVVar2,&local_140,
               local_118.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
               _M_impl.super__Vector_impl_data._M_start);
  }
  _Var12._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_f8.
                 super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl
                 .super__Vector_impl_data._M_start;
  if ((local_f8.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
       super__Vector_impl_data._M_start !=
       local_f8.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     (local_118.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_118.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    VVar17 = *(VkColorSpaceKHR *)
              ((long)&(local_f8.
                       super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
                       _M_impl.super__Vector_impl_data._M_start)->format + 4);
    p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_f8.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
              _M_impl.super__Vector_impl_data._M_start;
    VVar16 = VK_FORMAT_B8G8R8A8_UNORM;
    if ((long)local_f8.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_f8.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
              _M_impl.super__Vector_impl_data._M_start != 8 ||
        (local_f8.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
         _M_impl.super__Vector_impl_data._M_start)->format != VK_FORMAT_UNDEFINED) {
      do {
        if (*(int *)&p_Var11->_vptr__Sp_counted_base == 0x2c) {
          VVar17 = *(VkColorSpaceKHR *)((long)&p_Var11->_vptr__Sp_counted_base + 4);
          VVar16 = VK_FORMAT_B8G8R8A8_UNORM;
          break;
        }
        p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&p_Var11->_M_use_count;
        VVar16 = (local_f8.
                  super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
                  _M_impl.super__Vector_impl_data._M_start)->format;
      } while (p_Var11 !=
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_f8.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    VVar13 = VK_PRESENT_MODE_FIFO_KHR;
    pVVar8 = local_118.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (!use_vsync) {
      do {
        if (*pVVar8 == VK_PRESENT_MODE_MAILBOX_KHR) {
          VVar13 = VK_PRESENT_MODE_MAILBOX_KHR;
          goto LAB_001a5a5f;
        }
        pVVar8 = pVVar8 + 1;
      } while (pVVar8 != local_118.
                         super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
      VVar13 = VK_PRESENT_MODE_IMMEDIATE_KHR;
    }
LAB_001a5a5f:
    if (local_d4.currentExtent.width == ~VK_STRUCTURE_TYPE_APPLICATION_INFO) {
      glfwGetWindowSize(((((present_queue->
                           super___shared_ptr<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->m_surface_ptr).
                         super___shared_ptr<myvk::Surface,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        m_window,(int *)&local_98,(int *)&local_11c);
      local_d4.currentExtent.width = local_d4.maxImageExtent.width;
      if (local_98.sType < local_d4.maxImageExtent.width) {
        local_d4.currentExtent.width = local_98.sType;
      }
      if (local_d4.currentExtent.width < local_d4.minImageExtent.width) {
        local_d4.currentExtent.width = local_d4.minImageExtent.width;
      }
      if (local_11c < local_d4.maxImageExtent.height) {
        local_d4.maxImageExtent.height = local_11c;
      }
      local_d4.currentExtent.height = local_d4.maxImageExtent.height;
      if (local_d4.maxImageExtent.height < local_d4.minImageExtent.height) {
        local_d4.currentExtent.height = local_d4.minImageExtent.height;
      }
    }
    uVar10 = local_d4.minImageCount + 1;
    local_98.minImageCount = local_d4.maxImageCount;
    if (uVar10 < local_d4.maxImageCount) {
      local_98.minImageCount = uVar10;
    }
    if (local_d4.maxImageCount == 0) {
      local_98.minImageCount = uVar10;
    }
    local_98.pNext = (void *)0x0;
    local_98.flags = 0;
    local_98._20_4_ = 0;
    local_98.sType = VK_STRUCTURE_TYPE_SWAPCHAIN_CREATE_INFO_KHR;
    local_98._4_4_ = 0;
    local_98.surface = pVVar2;
    local_98.imageFormat = VVar16;
    local_98.imageExtent.width = local_d4.currentExtent.width;
    local_98.imageColorSpace = VVar17;
    local_98.imageArrayLayers = 1;
    local_98.imageExtent.height = local_d4.currentExtent.height;
    local_98.imageSharingMode._0_1_ =
         ((((present_queue->super___shared_ptr<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr)->super_Queue).m_unique_queue_ptr.
          super___shared_ptr<myvk::UniqueQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_family_index
         != ((((graphics_queue->super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
             ->m_unique_queue_ptr).super___shared_ptr<myvk::UniqueQueue,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->m_family_index;
    local_98.pQueueFamilyIndices = local_a0;
    if (!(bool)(undefined1)local_98.imageSharingMode) {
      local_98.pQueueFamilyIndices = (uint32_t *)0x0;
    }
    local_98.imageUsage = local_120;
    local_98.imageSharingMode._1_3_ = 0;
    local_98._68_4_ = 0;
    local_98.queueFamilyIndexCount = (uint)(byte)(undefined1)local_98.imageSharingMode * 2;
    local_98.preTransform = local_d4.currentTransform;
    local_98.compositeAlpha = VK_COMPOSITE_ALPHA_OPAQUE_BIT_KHR;
    local_98.presentMode = VVar13;
    local_98.clipped = 1;
    local_98.oldSwapchain = (VkSwapchainKHR)0x0;
    pVVar14 = &local_98;
    pp_Var15 = local_138 + 8;
    for (lVar9 = 0xd; p_Var3 = vkCreateSwapchainKHR, lVar9 != 0; lVar9 = lVar9 + -1) {
      *pp_Var15 = *(_func_int **)pVVar14;
      pVVar14 = (VkSwapchainCreateInfoKHR *)((long)pVVar14 + ((ulong)bVar18 * -2 + 1) * 8);
      pp_Var15 = pp_Var15 + (ulong)bVar18 * -2 + 1;
    }
    iVar6 = (*(((graphics_queue->super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
               )->super_DeviceObjectBase).super_Base._vptr_Base[2])();
    VVar7 = (*p_Var3)(*(VkDevice *)(*(long *)CONCAT44(extraout_var_00,iVar6) + 0x268),&local_98,
                      (VkAllocationCallbacks *)0x0,(VkSwapchainKHR *)(local_138 + 7));
    p_Var4 = vkGetSwapchainImagesKHR;
    _Var12._M_pi = extraout_RDX;
    if (VVar7 == VK_SUCCESS) {
      iVar6 = (*(((graphics_queue->super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
      (*p_Var4)(*(VkDevice *)(*(long *)CONCAT44(extraout_var_01,iVar6) + 0x268),
                (VkSwapchainKHR)local_138[7],(uint32_t *)(local_138 + 0x15),(VkImage *)0x0);
      peVar5 = peStack_130;
      peStack_130 = (element_type *)0x0;
      (this->super_DeviceObjectBase).super_Base._vptr_Base = local_138;
      (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>.
      _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
      local_138 = (_func_int **)0x0;
      _Var12._M_pi = extraout_RDX_03;
      goto LAB_001a5bce;
    }
  }
  (this->super_DeviceObjectBase).super_Base._vptr_Base = (_func_int **)0x0;
  (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
LAB_001a5bce:
  if (local_118.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
      super__Vector_impl_data._M_start != (VkPresentModeKHR *)0x0) {
    operator_delete(local_118.
                    super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    _Var12._M_pi = extraout_RDX_00;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_f8.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
      super__Vector_impl_data._M_start != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete(local_f8.
                    super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.
                          super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.
                          super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    _Var12._M_pi = extraout_RDX_01;
  }
  if (peStack_130 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_130);
    _Var12._M_pi = extraout_RDX_02;
  }
  PVar19.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var12._M_pi;
  PVar19.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<Swapchain>)PVar19.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<Swapchain> Swapchain::Create(const Ptr<Queue> &graphics_queue, const Ptr<PresentQueue> &present_queue,
                                 bool use_vsync, VkImageUsageFlags image_usage) {
	auto ret = std::make_shared<Swapchain>();
	ret->m_graphics_queue_ptr = graphics_queue;
	ret->m_present_queue_ptr = present_queue;

	VkPhysicalDevice physical_device = graphics_queue->GetDevicePtr()->GetPhysicalDevicePtr()->GetHandle();
	VkSurfaceKHR surface = present_queue->GetSurfacePtr()->GetHandle();

	VkSurfaceCapabilitiesKHR capabilities;
	std::vector<VkSurfaceFormatKHR> surface_formats;
	std::vector<VkPresentModeKHR> present_modes;

	vkGetPhysicalDeviceSurfaceCapabilitiesKHR(physical_device, surface, &capabilities);

	uint32_t format_count;
	vkGetPhysicalDeviceSurfaceFormatsKHR(physical_device, surface, &format_count, nullptr);
	if (format_count != 0) {
		surface_formats.resize(format_count);
		vkGetPhysicalDeviceSurfaceFormatsKHR(physical_device, surface, &format_count, surface_formats.data());
	}
	uint32_t present_mode_count;
	vkGetPhysicalDeviceSurfacePresentModesKHR(physical_device, surface, &present_mode_count, nullptr);
	if (present_mode_count != 0) {
		present_modes.resize(present_mode_count);
		vkGetPhysicalDeviceSurfacePresentModesKHR(physical_device, surface, &present_mode_count, present_modes.data());
	}
	if (surface_formats.empty() || present_modes.empty())
		return nullptr;

	// select surface format
	VkSurfaceFormatKHR surface_format = surface_formats.front();
	if (surface_formats.size() == 1 && surface_formats.front().format == VK_FORMAT_UNDEFINED)
		surface_format.format = VK_FORMAT_B8G8R8A8_UNORM;
	else {
		for (const auto &i : surface_formats)
			if (i.format == VK_FORMAT_B8G8R8A8_UNORM) {
				surface_format = i;
				break;
			}
	}

	// select present mode
	VkPresentModeKHR present_mode = VK_PRESENT_MODE_FIFO_KHR;
	if (!use_vsync) {
		present_mode = VK_PRESENT_MODE_IMMEDIATE_KHR;
		for (const auto &i : present_modes)
			if (i == VK_PRESENT_MODE_MAILBOX_KHR) {
				present_mode = i;
				break;
			}
	}

	// query extent
	VkExtent2D extent = capabilities.currentExtent;
	if (capabilities.currentExtent.width == UINT32_MAX) {
		int width, height;
		glfwGetWindowSize(present_queue->GetSurfacePtr()->GetGlfwWindow(), &width, &height);
		extent = {(uint32_t)width, (uint32_t)height};

		extent.width =
		    std::max(capabilities.minImageExtent.width, std::min(capabilities.maxImageExtent.width, extent.width));
		extent.height =
		    std::max(capabilities.minImageExtent.height, std::min(capabilities.maxImageExtent.height, extent.height));
	}

	// query image count
	uint32_t image_count = capabilities.minImageCount + 1u;
	if (capabilities.maxImageCount > 0 && image_count > capabilities.maxImageCount)
		image_count = capabilities.maxImageCount;

	// create swapchain
	VkSwapchainCreateInfoKHR create_info = {};
	create_info.sType = VK_STRUCTURE_TYPE_SWAPCHAIN_CREATE_INFO_KHR;
	create_info.surface = surface;
	create_info.minImageCount = image_count;
	create_info.imageFormat = surface_format.format;
	create_info.imageColorSpace = surface_format.colorSpace;
	create_info.imageExtent = extent;
	create_info.imageArrayLayers = 1;
	create_info.imageUsage = image_usage;

	if (present_queue->GetFamilyIndex() != graphics_queue->GetFamilyIndex()) {
		uint32_t queue_family_indices[] = {graphics_queue->GetFamilyIndex(), present_queue->GetFamilyIndex()};
		create_info.imageSharingMode = VK_SHARING_MODE_CONCURRENT;
		create_info.queueFamilyIndexCount = 2;
		create_info.pQueueFamilyIndices = queue_family_indices;
	} else {
		create_info.imageSharingMode = VK_SHARING_MODE_EXCLUSIVE;
		create_info.queueFamilyIndexCount = 0;
		create_info.pQueueFamilyIndices = nullptr;
	}
	create_info.preTransform = capabilities.currentTransform;
	create_info.compositeAlpha = VK_COMPOSITE_ALPHA_OPAQUE_BIT_KHR;
	create_info.presentMode = present_mode;
	create_info.clipped = VK_TRUE;
	create_info.oldSwapchain = VK_NULL_HANDLE;

	// set constants
	ret->m_swapchain_create_info = create_info;

	if (vkCreateSwapchainKHR(graphics_queue->GetDevicePtr()->GetHandle(), &create_info, nullptr, &ret->m_swapchain) !=
	    VK_SUCCESS)
		return nullptr;

	// get image count
	vkGetSwapchainImagesKHR(graphics_queue->GetDevicePtr()->GetHandle(), ret->m_swapchain, &ret->m_image_count,
	                        nullptr);

	return ret;
}